

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_support.h
# Opt level: O0

PyObject * pybind11::detail::make_new_instance(PyTypeObject *type,bool allocate_value)

{
  void ***this;
  bool bVar1;
  instance *this_00;
  value_and_holder *this_01;
  void **ppvVar2;
  void *pvVar3;
  void **vptr;
  value_and_holder *v_h;
  iterator __end3;
  iterator __begin3;
  values_and_holders *__range3;
  instance *inst;
  PyObject *self;
  bool allocate_value_local;
  PyTypeObject *type_local;
  
  this_00 = (instance *)(*type->tp_alloc)(type,0);
  instance::allocate_layout(this_00);
  this_00->field_0x30 = this_00->field_0x30 & 0xfe | 1;
  if (allocate_value) {
    values_and_holders::values_and_holders((values_and_holders *)&__begin3.curr.vh,this_00);
    this = &__begin3.curr.vh;
    values_and_holders::begin((iterator *)&__end3.curr.vh,(values_and_holders *)this);
    values_and_holders::end((iterator *)&v_h,(values_and_holders *)this);
    while (bVar1 = values_and_holders::iterator::operator!=
                             ((iterator *)&__end3.curr.vh,(iterator *)&v_h), bVar1) {
      this_01 = values_and_holders::iterator::operator*((iterator *)&__end3.curr.vh);
      ppvVar2 = value_and_holder::value_ptr<void>(this_01);
      pvVar3 = (*this_01->type->operator_new)(this_01->type->type_size);
      *ppvVar2 = pvVar3;
      register_instance(this_00,*ppvVar2,this_01->type);
      values_and_holders::iterator::operator++((iterator *)&__end3.curr.vh);
    }
  }
  return &this_00->ob_base;
}

Assistant:

inline PyObject *make_new_instance(PyTypeObject *type, bool allocate_value /*= true (in cast.h)*/) {
#if defined(PYPY_VERSION)
    // PyPy gets tp_basicsize wrong (issue 2482) under multiple inheritance when the first inherited
    // object is a a plain Python type (i.e. not derived from an extension type).  Fix it.
    ssize_t instance_size = static_cast<ssize_t>(sizeof(instance));
    if (type->tp_basicsize < instance_size) {
        type->tp_basicsize = instance_size;
    }
#endif
    PyObject *self = type->tp_alloc(type, 0);
    auto inst = reinterpret_cast<instance *>(self);
    // Allocate the value/holder internals:
    inst->allocate_layout();

    inst->owned = true;
    // Allocate (if requested) the value pointers; otherwise leave them as nullptr
    if (allocate_value) {
        for (auto &v_h : values_and_holders(inst)) {
            void *&vptr = v_h.value_ptr();
            vptr = v_h.type->operator_new(v_h.type->type_size);
            register_instance(inst, vptr, v_h.type);
        }
    }

    return self;
}